

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

BasicBlock * __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CreateDefaultBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,bool null_const_for_phi_is_needed,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *phi_operands,uint32_t merge_block_id)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint32_t type_id;
  IRContext *this_01;
  DefUseManager *this_02;
  reference pvVar1;
  uint32_t local_4c;
  Instruction *local_48;
  Instruction *null_const_inst;
  Instruction *inst;
  BasicBlock *default_block;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_28;
  uint32_t merge_block_id_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *phi_operands_local;
  ReplaceDescArrayAccessUsingVarIndex *pRStack_18;
  bool null_const_for_phi_is_needed_local;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  default_block._4_4_ = merge_block_id;
  pvStack_28 = phi_operands;
  phi_operands_local._7_1_ = null_const_for_phi_is_needed;
  pRStack_18 = this;
  inst = (Instruction *)CreateNewBlock(this);
  AddBranchToBlock(this,(BasicBlock *)inst,default_block._4_4_);
  if ((phi_operands_local._7_1_ & 1) == 0) {
    this_local = (ReplaceDescArrayAccessUsingVarIndex *)inst;
  }
  else {
    this_01 = Pass::context(&this->super_Pass);
    this_02 = IRContext::get_def_use_mgr(this_01);
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvStack_28,0);
    null_const_inst = analysis::DefUseManager::GetDef(this_02,*pvVar1);
    type_id = opt::Instruction::type_id(null_const_inst);
    local_48 = GetConstNull(this,type_id);
    this_00 = pvStack_28;
    local_4c = opt::Instruction::result_id(local_48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&local_4c);
    this_local = (ReplaceDescArrayAccessUsingVarIndex *)inst;
  }
  return (BasicBlock *)this_local;
}

Assistant:

BasicBlock* ReplaceDescArrayAccessUsingVarIndex::CreateDefaultBlock(
    bool null_const_for_phi_is_needed, std::vector<uint32_t>* phi_operands,
    uint32_t merge_block_id) const {
  auto* default_block = CreateNewBlock();
  AddBranchToBlock(default_block, merge_block_id);
  if (!null_const_for_phi_is_needed) return default_block;

  // Create null value for OpPhi
  Instruction* inst = context()->get_def_use_mgr()->GetDef((*phi_operands)[0]);
  auto* null_const_inst = GetConstNull(inst->type_id());
  phi_operands->push_back(null_const_inst->result_id());
  return default_block;
}